

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::embeddings_gradient
               (tensor *prev,tensor *gradient_input,tensor *grads,tensor *freqs,float learning_rate,
               bool scale)

{
  thread_pool_implementation *this;
  task_state_type *ptVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  thread_pool *ptVar5;
  unsigned_long uVar6;
  long lVar7;
  pthread_t id;
  long lVar8;
  code *pcVar9;
  uint64 uVar10;
  ostream *poVar11;
  fatal_error *this_00;
  long lVar12;
  long lVar13;
  long i;
  long lVar14;
  long nc;
  long nr;
  long nk;
  float *grads_data;
  float *freqs_data;
  float *gradient_input_data;
  float *prev_data;
  vector<dlib::mutex,_std::allocator<dlib::mutex>_> embedding_mutexes;
  ostringstream dlib_o_out;
  undefined1 local_265;
  float local_264;
  allocator_type **local_260;
  code *local_258;
  long local_250;
  long local_248;
  thread_pool *local_240;
  long local_238;
  long local_230;
  string local_228;
  long local_208;
  longlong local_200;
  longlong local_1f8;
  long local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  vector<dlib::mutex,_std::allocator<dlib::mutex>_> local_1c8;
  allocator_type *local_1b0;
  long *local_1a8;
  longlong *local_1a0;
  undefined8 *local_198;
  tensor *local_190;
  tensor *local_188;
  undefined8 *local_180;
  undefined1 *local_178;
  vector<dlib::mutex,_std::allocator<dlib::mutex>_> *local_170;
  longlong *local_168;
  undefined8 *local_160;
  tensor *local_158;
  undefined8 *local_150;
  float *local_148;
  
  local_265 = scale;
  local_264 = learning_rate;
  if ((((((0 < prev->m_nr) && (gradient_input->m_n == prev->m_n)) &&
        (gradient_input->m_k == prev->m_k)) &&
       ((gradient_input->m_nr == prev->m_nr && (gradient_input->m_nc == grads->m_k)))) &&
      ((0 < grads->m_k && ((0 < grads->m_n && (grads->m_nr == 1)))))) && (grads->m_nc == 1)) {
    iVar4 = (*prev->_vptr_tensor[2])(prev);
    local_1d0 = CONCAT44(extraout_var,iVar4);
    iVar4 = (*gradient_input->_vptr_tensor[2])(gradient_input);
    local_1d8 = CONCAT44(extraout_var_00,iVar4);
    iVar4 = (*freqs->_vptr_tensor[2])(freqs);
    local_1e0 = CONCAT44(extraout_var_01,iVar4);
    iVar4 = (*grads->_vptr_tensor[3])(grads);
    local_1e8 = CONCAT44(extraout_var_02,iVar4);
    lVar13 = gradient_input->m_n;
    local_1f0 = gradient_input->m_k;
    local_1f8 = gradient_input->m_nr;
    local_200 = gradient_input->m_nc;
    std::vector<dlib::mutex,_std::allocator<dlib::mutex>_>::vector
              (&local_1c8,grads->m_n,(allocator_type *)&local_1a8);
    local_1a8 = &local_1f0;
    lVar13 = lVar13 * local_1f0;
    local_1a0 = &local_1f8;
    local_198 = &local_1d0;
    local_180 = &local_1e0;
    local_178 = &local_265;
    local_168 = &local_200;
    local_160 = &local_1d8;
    local_150 = &local_1e8;
    local_148 = &local_264;
    local_190 = prev;
    local_188 = grads;
    local_170 = &local_1c8;
    local_158 = gradient_input;
    ptVar5 = default_thread_pool();
    local_260 = &local_1b0;
    local_258 = impl::
                helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>
                ::run;
    local_250 = 0;
    local_1b0 = (allocator_type *)&local_1a8;
    uVar6 = thread_pool_implementation::num_threads_in_pool
                      ((ptVar5->impl).
                       super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (uVar6 == 0) {
      if (0 < lVar13) {
        lVar8 = 0;
        do {
          pcVar9 = local_258;
          if (((ulong)local_258 & 1) != 0) {
            pcVar9 = *(code **)(local_258 + *(long *)((long)local_260 + local_250) + -1);
          }
          (*pcVar9)((long *)((long)local_260 + local_250),lVar8);
          lVar8 = lVar8 + 1;
        } while (lVar13 - lVar8 != 0);
      }
    }
    else {
      uVar6 = thread_pool_implementation::num_threads_in_pool
                        ((ptVar5->impl).
                         super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      lVar7 = lVar13 / (long)(uVar6 << 3);
      lVar8 = 1;
      if (1 < lVar7) {
        lVar8 = lVar7;
      }
      if (0 < lVar13) {
        lVar7 = lVar8;
        lVar14 = 0;
        local_248 = lVar8;
        local_240 = ptVar5;
        local_238 = lVar13;
        do {
          lVar12 = lVar13;
          if (lVar8 < lVar13) {
            lVar12 = lVar8;
          }
          local_208 = lVar14 + lVar7;
          if (local_208 < lVar13) {
            lVar13 = local_208;
          }
          this = (ptVar5->impl).
                 super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
          local_228._M_dataplus._M_p = (pointer)&this->m;
          local_228._M_string_length = 0;
          local_228.field_2._M_allocated_capacity = 0;
          local_230 = lVar8;
          pthread_mutex_lock((pthread_mutex_t *)local_228._M_dataplus._M_p);
          id = pthread_self();
          lVar8 = thread_pool_implementation::find_empty_task_slot(this);
          if ((lVar8 == -1) &&
             (bVar3 = thread_pool_implementation::is_worker_thread(this,id), bVar3)) {
            auto_mutex::unlock((auto_mutex *)&local_228);
            lVar8 = local_230;
            lVar13 = local_238;
            ptVar5 = local_240;
            lVar7 = local_248;
            do {
              pcVar9 = local_258;
              if (((ulong)local_258 & 1) != 0) {
                pcVar9 = *(code **)(local_258 + *(long *)((long)local_260 + local_250) + -1);
              }
              (*pcVar9)((long *)((long)local_260 + local_250),lVar14);
              lVar14 = lVar14 + 1;
            } while (lVar12 != lVar14);
          }
          else {
            while (lVar8 == -1) {
              pthread_cond_wait((pthread_cond_t *)&(this->task_done_signaler).cond,
                                (pthread_mutex_t *)(this->task_done_signaler).associated_mutex);
              lVar8 = thread_pool_implementation::find_empty_task_slot(this);
            }
            (this->tasks).array_elements[lVar8].thread_id = id;
            uVar10 = thread_pool_implementation::make_next_task_id(this,lVar8);
            ptVar1 = (this->tasks).array_elements;
            ptVar1[lVar8].task_id = uVar10;
            (*(code *)**ptVar1[lVar8].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data)();
            puVar2 = (undefined8 *)
                     ptVar1[lVar8].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data;
            puVar2[1] = &local_260;
            *(undefined4 *)(puVar2 + 2) = 0;
            puVar2[3] = impl::
                        helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>_>
                        ::process_block;
            puVar2[4] = 0;
            *puVar2 = &PTR__mp_base_base_001fb670;
            ptVar1 = (this->tasks).array_elements;
            ptVar1[lVar8].arg1 = lVar14;
            ptVar1[lVar8].arg2 = lVar13;
            pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
            lVar8 = local_230;
            lVar13 = local_238;
            lVar7 = local_248;
            ptVar5 = local_240;
          }
          auto_mutex::unlock((auto_mutex *)&local_228);
          lVar8 = lVar8 + lVar7;
          lVar14 = local_208;
        } while (local_208 < lVar13);
      }
      thread_pool_implementation::wait_for_all_tasks
                ((ptVar5->impl).
                 super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    std::vector<dlib::mutex,_std::allocator<dlib::mutex>_>::~vector(&local_1c8);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\n\nError detected at line ",0x19);
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&local_1a8,0x9fd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
             ,0x77);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "void dlib::cpu::embeddings_gradient(const tensor &, const tensor &, tensor &, const tensor &, float, bool)"
             ,0x6a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "prev.nr() > 0 && gradient_input.num_samples() == prev.num_samples() && gradient_input.k() == prev.k() && gradient_input.nr() == prev.nr() && gradient_input.nc() == grads.k() && grads.num_samples() > 0 && grads.k() > 0 && grads.nr() == 1 && grads.nc() == 1"
             ,0xff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n",2);
  *(uint *)((long)&local_190 + local_1a8[-3]) = *(uint *)((long)&local_190 + local_1a8[-3]) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\ngradient_input.num_samples(): ",0x1f);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngradient_input.k(): ",0x15);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngradient_input.nr(): ",0x16);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngradient_input.nc(): ",0x16);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nprev.num_samples(): ",0x15);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nprev.k(): ",0xb);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nprev.nr(): ",0xc);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nprev.nc(): ",0xc);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngrads.num_samples(): ",0x16);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngrads.k(): ",0xc);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngrads.nr(): ",0xd);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\ngrads.nc(): ",0xd);
  poVar11 = std::ostream::_M_insert<long_long>((longlong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_228);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

void embeddings_gradient(
            const tensor& prev,
            const tensor& gradient_input,
            tensor& grads,
            const tensor& freqs,
            float learning_rate,
            bool scale
        )
        {
            DLIB_CASSERT(
                prev.nr() > 0 &&
                gradient_input.num_samples() == prev.num_samples() &&
                gradient_input.k() == prev.k() &&
                gradient_input.nr() == prev.nr() &&
                gradient_input.nc() == grads.k() &&
                grads.num_samples() > 0 &&
                grads.k() > 0 &&
                grads.nr() == 1 &&
                grads.nc() == 1,
                "\ngradient_input.num_samples(): " << gradient_input.num_samples() <<
                "\ngradient_input.k(): " << gradient_input.k() <<
                "\ngradient_input.nr(): " << gradient_input.nr() <<
                "\ngradient_input.nc(): " << gradient_input.nc() <<
                "\nprev.num_samples(): " << prev.num_samples() <<
                "\nprev.k(): " << prev.k() <<
                "\nprev.nr(): " << prev.nr() <<
                "\nprev.nc(): " << prev.nc() <<
                "\ngrads.num_samples(): " << grads.num_samples() <<
                "\ngrads.k(): " << grads.k() <<
                "\ngrads.nr(): " << grads.nr() <<
                "\ngrads.nc(): " << grads.nc()
            );

            const float* prev_data = prev.host();
            const float* gradient_input_data = gradient_input.host();
            const float* freqs_data = freqs.host();
            float* grads_data = grads.host();
            long ns = gradient_input.num_samples(), nk = gradient_input.k();
            long nr = gradient_input.nr(), nc = gradient_input.nc();

            std::vector<dlib::mutex> embedding_mutexes(grads.num_samples());
            parallel_for(0, ns * nk, [&](long i)
                {
                    long s = i / nk;
                    long k = i % nk;

                    for (long r = 0; r < nr; ++r)
                    {
                        const unsigned long token_idx = static_cast<unsigned long>(prev_data[tensor_index(prev, s, k, r, 0)]);
                        if (token_idx < grads.num_samples())
                        {
                            const float freg_token = freqs_data[token_idx];
                            float freq_scale = 1.0f;

                            if (scale && freg_token != 0.0f) freq_scale = std::min(0.15f, std::max(1.0f / freg_token, 1.0f));
                            auto_mutex locker(embedding_mutexes[token_idx]);
                            for (long c = 0; c < nc; ++c)
                            {
                                const float gradient = gradient_input_data[tensor_index(gradient_input, s, k, r, c)];
                                grads_data[tensor_index(grads, token_idx, c, 0, 0)] -= (gradient * learning_rate * freq_scale);
                            }
                        }
                    }
                });
        }